

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void apply_imputation_results<PredictionData<double,unsigned_long>,ImputedData<unsigned_long,double>>
               (PredictionData<double,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_double> *imp,Imputer *imputer,size_t row)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  pointer puVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  double *pdVar8;
  size_t sVar9;
  unsigned_long uVar10;
  ulong uVar11;
  pointer pvVar12;
  int *piVar13;
  int iVar14;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var15;
  long lVar16;
  size_t ix;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  double dVar20;
  
  bVar2 = prediction_data->is_col_major;
  sVar3 = imp->n_missing_num;
  puVar4 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = prediction_data->numeric_data;
  if (bVar2 == false) {
    sVar9 = imputer->ncols_numeric;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      uVar10 = puVar4[sVar18];
      dVar1 = pdVar6[sVar18];
      if (((dVar1 <= 0.0) || (dVar20 = pdVar5[sVar18], 0x7fefffffffffffff < (ulong)ABS(dVar20))) ||
         ((dVar20 == 0.0 && ((!NAN(dVar20) && (NAN(pdVar7[uVar10]))))))) {
        dVar20 = pdVar7[uVar10];
      }
      else {
        dVar20 = dVar20 / dVar1;
      }
      pdVar8[sVar9 * row + uVar10] = dVar20;
    }
  }
  else {
    sVar9 = prediction_data->nrows;
    for (sVar18 = 0; sVar3 != sVar18; sVar18 = sVar18 + 1) {
      uVar10 = puVar4[sVar18];
      dVar1 = pdVar6[sVar18];
      if (((dVar1 <= 0.0) || (dVar20 = pdVar5[sVar18], 0x7fefffffffffffff < (ulong)ABS(dVar20))) ||
         ((dVar20 == 0.0 && ((!NAN(dVar20) && (NAN(pdVar7[uVar10]))))))) {
        dVar20 = pdVar7[uVar10];
      }
      else {
        dVar20 = dVar20 / dVar1;
      }
      pdVar8[row + uVar10 * sVar9] = dVar20;
    }
  }
  pdVar8 = prediction_data->Xr;
  if (pdVar8 != (double *)0x0) {
    uVar11 = prediction_data->Xr_indptr[row + 1];
    pdVar5 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (imp->missing_sp).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = 0;
    for (uVar17 = prediction_data->Xr_indptr[row]; uVar17 < uVar11; uVar17 = uVar17 + 1) {
      if (0x7fefffffffffffff < (ulong)ABS(pdVar8[uVar17])) {
        dVar1 = pdVar6[lVar19];
        if ((dVar1 <= 0.0) || (dVar20 = pdVar5[lVar19], 0x7fefffffffffffff < (ulong)ABS(dVar20))) {
          dVar20 = pdVar7[puVar4[lVar19]];
        }
        else {
          dVar20 = dVar20 / dVar1;
        }
        pdVar8[uVar17] = dVar20;
        lVar19 = lVar19 + 1;
      }
    }
  }
  if (bVar2 == false) {
    for (uVar17 = 0; uVar17 < imp->n_missing_cat; uVar17 = uVar17 + 1) {
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17];
      lVar19 = *(long *)&pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      _Var15 = std::
               __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar19,*(pointer *)
                                  ((long)&pvVar12[uVar10].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8));
      lVar16 = imputer->ncols_categ * row;
      piVar13 = prediction_data->categ_data;
      iVar14 = (int)((ulong)((long)_Var15._M_current - lVar19) >> 3);
      piVar13[uVar10 + lVar16] = iVar14;
      if (iVar14 == 0) {
        pvVar12 = (imp->cat_sum).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = -1;
        if ((pvVar12 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pdVar8 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
           pdVar8 != pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
          if (0.0 < *pdVar8) goto LAB_0022d6a0;
          iVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        }
        piVar13[uVar10 + lVar16] = iVar14;
      }
LAB_0022d6a0:
    }
  }
  else {
    for (uVar17 = 0; uVar17 < imp->n_missing_cat; uVar17 = uVar17 + 1) {
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17];
      lVar19 = *(long *)&pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      _Var15 = std::
               __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (lVar19,*(pointer *)
                                  ((long)&pvVar12[uVar10].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + 8));
      lVar16 = prediction_data->nrows * uVar10;
      piVar13 = prediction_data->categ_data;
      iVar14 = (int)((ulong)((long)_Var15._M_current - lVar19) >> 3);
      piVar13[lVar16 + row] = iVar14;
      if (iVar14 == 0) {
        pvVar12 = (imp->cat_sum).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = -1;
        if ((pvVar12 !=
             (imp->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (pdVar8 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
           pdVar8 != pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
          if (0.0 < *pdVar8) goto LAB_0022d60e;
          iVar14 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
        }
        piVar13[lVar16 + row] = iVar14;
      }
LAB_0022d60e:
    }
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}